

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btStaticPlaneShape.cpp
# Opt level: O3

void __thiscall
btStaticPlaneShape::btStaticPlaneShape
          (btStaticPlaneShape *this,btVector3 *planeNormal,btScalar planeConstant)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  btConcaveShape::btConcaveShape(&this->super_btConcaveShape);
  (this->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape =
       (_func_int **)&PTR__btStaticPlaneShape_0021ea10;
  fVar2 = (float)*(undefined8 *)planeNormal->m_floats;
  fVar3 = (float)((ulong)*(undefined8 *)planeNormal->m_floats >> 0x20);
  uVar1 = *(undefined8 *)(planeNormal->m_floats + 2);
  fVar4 = (float)uVar1;
  fVar5 = 1.0 / SQRT(fVar4 * fVar4 + fVar2 * fVar2 + fVar3 * fVar3);
  (this->m_planeNormal).m_floats[0] = fVar5 * fVar2;
  (this->m_planeNormal).m_floats[1] = fVar5 * fVar3;
  (this->m_planeNormal).m_floats[2] = fVar4 * fVar5;
  (this->m_planeNormal).m_floats[3] = (btScalar)((ulong)uVar1 >> 0x20);
  this->m_planeConstant = planeConstant;
  (this->m_localScaling).m_floats[0] = 1.0;
  (this->m_localScaling).m_floats[1] = 1.0;
  (this->m_localScaling).m_floats[2] = 1.0;
  (this->m_localScaling).m_floats[3] = 0.0;
  (this->super_btConcaveShape).super_btCollisionShape.m_shapeType = 0x1c;
  return;
}

Assistant:

btStaticPlaneShape::btStaticPlaneShape(const btVector3& planeNormal,btScalar planeConstant)
: btConcaveShape (), m_planeNormal(planeNormal.normalized()),
m_planeConstant(planeConstant),
m_localScaling(btScalar(1.),btScalar(1.),btScalar(1.))
{
	m_shapeType = STATIC_PLANE_PROXYTYPE;
	//	btAssert( btFuzzyZero(m_planeNormal.length() - btScalar(1.)) );
}